

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

void __thiscall
Clasp::MinimizeBuilder::mergeLevels(MinimizeBuilder *this,SumVec *adjust,WeightVec *weights)

{
  pointer pLVar1;
  long *plVar2;
  int iVar3;
  pointer pMVar4;
  weight_t wVar5;
  pointer pMVar6;
  pointer pMVar7;
  pointer pMVar8;
  pointer pMVar9;
  LevelWeight local_58;
  pointer local_50;
  size_type local_44;
  pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_> *local_40;
  SumVec *local_38;
  
  pMVar9 = (this->lits_).ebo_.buf;
  local_38 = adjust;
  std::
  __stable_sort<Clasp::MinimizeBuilder::MLit*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpLit>>
            (pMVar9,pMVar9 + (this->lits_).ebo_.size);
  local_50 = (this->lits_).ebo_.buf;
  (weights->ebo_).size = 0;
  bk_lib::
  pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
  ::reserve(weights,(this->lits_).ebo_.size);
  pMVar9 = (this->lits_).ebo_.buf;
  pMVar8 = pMVar9 + (this->lits_).ebo_.size;
  local_40 = &this->lits_;
  while (pMVar9 != pMVar8) {
    local_44 = (weights->ebo_).size;
    local_58.weight = pMVar9->weight;
    local_58._0_4_ = pMVar9->prio & 0x7fffffff;
    bk_lib::
    pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
    ::push_back(weights,&local_58);
    pMVar6 = pMVar9;
    while ((pMVar4 = pMVar6, pMVar6 = pMVar4 + 1, pMVar7 = pMVar8, pMVar6 != pMVar8 &&
           (pMVar7 = pMVar6, ((pMVar9->lit).rep_ ^ (pMVar6->lit).rep_) < 4))) {
      pLVar1 = (weights->ebo_).buf + ((weights->ebo_).size - 1);
      *(uint *)pLVar1 = *(uint *)pLVar1 | 0x80000000;
      local_58.weight = pMVar4[1].weight;
      local_58._0_4_ = pMVar4[1].prio & 0x7fffffff;
      bk_lib::
      pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
      ::push_back(weights,&local_58);
      if ((((byte)(pMVar6->lit).rep_ ^ (byte)(pMVar9->lit).rep_) & 2) != 0) {
        iVar3 = pMVar4[1].weight;
        plVar2 = (local_38->ebo_).buf + (uint)pMVar4[1].prio;
        *plVar2 = *plVar2 + (long)iVar3;
        (weights->ebo_).buf[(weights->ebo_).size - 1].weight = -iVar3;
      }
    }
    wVar5 = pMVar9->prio;
    local_50->lit = (Literal)(pMVar9->lit).rep_;
    local_50->prio = wVar5;
    local_50->weight = local_44;
    local_50 = local_50 + 1;
    pMVar9 = pMVar7;
  }
  bk_lib::pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
  erase(local_40,local_50,(local_40->ebo_).buf + (local_40->ebo_).size);
  return;
}

Assistant:

void MinimizeBuilder::mergeLevels(SumVec& adjust, SharedData::WeightVec& weights) {
	// group first by variables and then by increasing levels
	std::stable_sort(lits_.begin(), lits_.end(), CmpLit());
	LitVec::iterator j = lits_.begin();
	weights.clear(); weights.reserve(lits_.size());
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(), k; it != end; it = k) {
		// handle first occurrence of var
		assert(it->weight > 0 && "most important occurrence of lit must have positive weight");
		weight_t wpos = (weight_t)weights.size();
		weights.push_back(SharedData::LevelWeight(it->prio, it->weight));
		// handle remaining occurrences with lower prios
		for (k = it + 1; k != end && k->lit.var() == it->lit.var(); ++k) {
			assert(k->prio > it->prio && "levels not prepared!");
			weights.back().next = 1;
			weights.push_back(SharedData::LevelWeight(k->prio, k->weight));
			if (k->lit.sign() != it->lit.sign()) {
				adjust[k->prio] += k->weight;
				weights.back().weight = -k->weight;
			}
		}
		(*j = *it).weight = wpos;
		++j;
	}
	lits_.erase(j, lits_.end());
}